

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O0

void match(int matches,long limit,int num_robots,string *command1,string *command2,string *command3,
          string *command4,bool outputToStdout,bool outputToFullScreen)

{
  bool bVar1;
  long lVar2;
  reference this;
  exception *anon_var_0;
  __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
  local_2198;
  iterator it;
  int local_2188;
  int iStack_2184;
  bool end;
  int i_1;
  pointer *local_2178;
  string *local_2170;
  type local_2168;
  bool *local_2158;
  string *local_2150;
  type local_2148;
  bool *local_2138;
  string *local_2130;
  type local_2128;
  undefined1 *local_2118;
  string *local_2110;
  type local_2108;
  undefined1 local_20f8 [8];
  vector<std::future<void>,_std::allocator<std::future<void>_>_> allServersThreads;
  Forth forth4;
  Forth forth3;
  Forth forth2;
  undefined1 local_8d0 [8];
  Forth forth1;
  long counter;
  int ties [4];
  int wins [4];
  int local_9c;
  int local_98;
  int k;
  int j;
  int i;
  int movement;
  int m_count;
  int robotsleft;
  bool outputToFullScreen_local;
  bool outputToStdout_local;
  string *command3_local;
  string *command2_local;
  string *command1_local;
  int num_robots_local;
  long limit_local;
  int matches_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  std::operator&(seq_cst,__memory_order_mask);
  LOCK();
  stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  forth1.traceCalls = false;
  forth1.trace = false;
  forth1._2042_6_ = 0;
  r_debug = 0;
  for (k = 0; k < num_robots; k = k + 1) {
    ties[(long)k + 2] = 0;
    ties[(long)k + -2] = 0;
  }
  if (num_robots < 2) {
    if (outputToStdout) {
      fprintf(_stderr,"\n\nCannot play without at least 2 robots.\n\n");
    }
  }
  else {
    for (i = 1; i <= matches; i = i + 1) {
      cppforth::Forth::Forth((Forth *)local_8d0);
      InitForthRobot((Forth *)local_8d0,step);
      InsertForthToInt((Forth *)local_8d0,0);
      cppforth::Forth::Forth((Forth *)&forth3.traceCalls);
      InitForthRobot((Forth *)&forth3.traceCalls,step);
      InsertForthToInt((Forth *)&forth3.traceCalls,1);
      cppforth::Forth::Forth((Forth *)&forth4.traceCalls);
      InitForthRobot((Forth *)&forth4.traceCalls,step);
      InsertForthToInt((Forth *)&forth4.traceCalls,2);
      cppforth::Forth::Forth
                ((Forth *)&allServersThreads.
                           super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      InitForthRobot((Forth *)&allServersThreads.
                               super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,step);
      InsertForthToInt((Forth *)&allServersThreads.
                                 super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_20f8);
      local_2118 = local_8d0;
      local_2110 = command1;
      std::
      async<match(int,long,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool)::__0>
                (&local_2108);
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_20f8,
                 (value_type *)&local_2108);
      std::future<void>::~future((future<void> *)&local_2108);
      local_2138 = &forth3.traceCalls;
      local_2130 = command2;
      std::
      async<match(int,long,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool)::__1>
                (&local_2128);
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_20f8,
                 (value_type *)&local_2128);
      std::future<void>::~future((future<void> *)&local_2128);
      local_2158 = &forth4.traceCalls;
      local_2150 = command3;
      std::
      async<match(int,long,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool)::__2>
                (&local_2148);
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_20f8,
                 (value_type *)&local_2148);
      std::future<void>::~future((future<void> *)&local_2148);
      local_2178 = &allServersThreads.
                    super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_2170 = command4;
      std::
      async<match(int,long,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,bool,bool)::__3>
                (&local_2168);
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::push_back
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_20f8,
                 (value_type *)&local_2168);
      std::future<void>::~future((future<void> *)&local_2168);
      if (outputToStdout) {
        printf("\nMatch %6d: ",(ulong)(uint)i);
      }
      for (k = 0; k < num_robots; k = k + 1) {
        init_robot(k);
        robots[k].status = 1;
      }
      rand_pos(num_robots);
      j = 0xf;
      forth1.traceCalls = false;
      forth1.trace = false;
      forth1._2042_6_ = 0;
      movement = num_robots;
      while (1 < movement && (long)forth1._2040_8_ < limit) {
        movement = 0;
        for (k = 0; k < num_robots; k = k + 1) {
          if (robots[k].status == 1) {
            movement = movement + 1;
            cur_robot = robots + k;
          }
        }
        cycle(num_robots);
        if (outputToFullScreen) {
          update_disp();
          iStack_2184 = 1;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1000l>> *)&i_1,&stack0xffffffffffffde7c);
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)&i_1);
        }
        j = j + -1;
        if (j == 0) {
          forth1._2040_8_ = forth1._2040_8_ + 0xf;
          j = 0xf;
          move_robots(0);
          move_miss(0);
          for (k = 0; k < num_robots; k = k + 1) {
            for (local_98 = 0; local_98 < 2; local_98 = local_98 + 1) {
              if (missiles[k][local_98].stat == 2) {
                count_miss(k,local_98);
              }
            }
          }
        }
      }
      while( true ) {
        bVar1 = false;
        for (k = 0; k < num_robots; k = k + 1) {
          for (local_98 = 0; local_98 < 2; local_98 = local_98 + 1) {
            if (missiles[k][local_98].stat == 1) {
              bVar1 = true;
            }
          }
        }
        if (!bVar1) break;
        move_robots(0);
        move_miss(0);
      }
      if (outputToStdout) {
        printf(" cycles = %ld:\n  Survivors:\n",forth1._2040_8_);
      }
      local_9c = 0;
      for (k = 0; k < num_robots; k = k + 1) {
        if (robots[k].status == 1) {
          if (outputToStdout) {
            printf("   (%d)%14s: damage=%% %d  ",(ulong)(k + 1),(long)k * 0xb8 + 0x1c52b4,
                   (ulong)(uint)robots[k].damage);
          }
          if (k == 1) {
            if (outputToStdout) {
              printf("\n");
            }
          }
          else if (outputToStdout) {
            printf("\t");
          }
          local_9c = local_9c + 1;
        }
      }
      if (local_9c == 0) {
        if (outputToStdout) {
          printf("mutual destruction\n");
        }
      }
      else if (outputToStdout) {
        printf("\n");
      }
      if (outputToStdout) {
        printf("  Cumulative score:\n");
      }
      for (k = 0; k < num_robots; k = k + 1) {
        if (robots[k].status == 1) {
          if (local_9c == 1) {
            ties[(long)k + 2] = ties[(long)k + 2] + 1;
          }
          else {
            ties[(long)k + -2] = ties[(long)k + -2] + 1;
          }
        }
        if (outputToStdout) {
          lVar2 = (long)k;
          printf("   (%d)%14s: wins=%d ties=%d  ",(ulong)(k + 1),lVar2 * 0xb8 + 0x1c52b4,
                 (ulong)(uint)ties[lVar2 + 2],(ulong)(uint)ties[lVar2 + -2]);
        }
        if (k == 1) {
          if (outputToStdout) {
            printf("\n");
          }
        }
        else if (outputToStdout) {
          printf("\t");
        }
      }
      if (outputToStdout) {
        printf("\n");
      }
      std::operator&(seq_cst,__memory_order_mask);
      LOCK();
      stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)1;
      UNLOCK();
      for (local_2188 = 0; local_2188 < 10000; local_2188 = local_2188 + 1) {
        it._M_current._7_1_ = '\x01';
        for (local_98 = 0; local_98 < 4; local_98 = local_98 + 1) {
          if (robotStatus[local_98] != StatusException) {
            it._M_current._7_1_ = '\0';
          }
        }
        if (it._M_current._7_1_ != '\0') break;
        cycle(num_robots);
        std::this_thread::yield();
      }
      local_2198._M_current =
           (future<void> *)
           std::begin<std::vector<std::future<void>,std::allocator<std::future<void>>>>
                     ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_20f8);
      while( true ) {
        anon_var_0 = (exception *)
                     std::end<std::vector<std::future<void>,std::allocator<std::future<void>>>>
                               ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)
                                local_20f8);
        bVar1 = __gnu_cxx::
                operator==<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                          (&local_2198,
                           (__normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
                            *)&anon_var_0);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        this = __gnu_cxx::
               __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
               ::operator*(&local_2198);
        std::future<void>::get(this);
        __gnu_cxx::
        __normal_iterator<std::future<void>_*,_std::vector<std::future<void>,_std::allocator<std::future<void>_>_>_>
        ::operator++(&local_2198);
      }
      std::operator&(seq_cst,__memory_order_mask);
      LOCK();
      UNLOCK();
      stopAll.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
      std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector
                ((vector<std::future<void>,_std::allocator<std::future<void>_>_> *)local_20f8);
      cppforth::Forth::~Forth
                ((Forth *)&allServersThreads.
                           super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cppforth::Forth::~Forth((Forth *)&forth4.traceCalls);
      cppforth::Forth::~Forth((Forth *)&forth3.traceCalls);
      cppforth::Forth::~Forth((Forth *)local_8d0);
    }
    if (outputToStdout) {
      fprintf(_stderr,"\nMatch play finished.\n\n");
    }
  }
  return;
}

Assistant:

void match(int matches,
long limit,
int num_robots,
const std::string &command1,
const std::string &command2,
const std::string &command3,
const std::string &command4,
bool outputToStdout=false,
bool outputToFullScreen=false
)
{
	//int num_robots = 0;
	stopAll.store(0);
	int robotsleft{};
	int m_count{};
	int movement{};
	int i{}, j{}, k{};
	int wins[MAXROBOTS];
	int ties[MAXROBOTS];
	long counter{};

	r_debug = 0;  /* turns off full compile info */

	for (i = 0; i < num_robots; i++) {
		wins[i] = 0;
		ties[i] = 0;
	}
	//num_robots=2;
	if (num_robots < 2) {
		if (outputToStdout) fprintf(stderr, "\n\nCannot play without at least 2 robots.\n\n");
		return;
	}

	for (m_count = 1; m_count <= matches; m_count++) {
		cppforth::Forth forth1{};
		InitForthRobot(forth1);
		InsertForthToInt(&forth1, 0);
		cppforth::Forth forth2{};
		InitForthRobot(forth2);
		InsertForthToInt(&forth2, 1);
		cppforth::Forth forth3{};
		InitForthRobot(forth3);
		InsertForthToInt(&forth3, 2);
		cppforth::Forth forth4{};
		InitForthRobot(forth4);
		InsertForthToInt(&forth4, 3);

		std::vector<std::future<void>> allServersThreads;
		allServersThreads.push_back(
			std::async([&forth1, &command1]{
			try{
				robotStatus[0] = StatusRun;
				forth1.ExecuteString(command1);
				robotStatus[0] = StatusException;
			}
			catch (...){
				robotStatus[0] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth2, &command2]{
			try{
				robotStatus[1] = StatusRun;
				forth2.ExecuteString(command2);
				robotStatus[1] = StatusException;
			}
			catch (...){
				robotStatus[1] = StatusException;
			}
		})
			);
		allServersThreads.push_back(
			std::async([&forth3, &command3]{
			try{
				robotStatus[2] = StatusRun;
				forth3.ExecuteString(command3);
				robotStatus[2] = StatusException;
			}
			catch (...){
				robotStatus[2] = StatusException;
			}
		}));
		allServersThreads.push_back(
			std::async([&forth4, &command4]{
			try{
				robotStatus[3] = StatusRun;
				forth4.ExecuteString(command4);
				robotStatus[3] = StatusException;
			}
			catch (...){
				robotStatus[3] = StatusException;
			}
		}));
		if (outputToStdout) printf("\nMatch %6d: ", m_count);
for (i = 0; i < num_robots; i++) {
	init_robot(i);
	// robot_go should be here
	robots[i].status = ACTIVE;
}
rand_pos(num_robots);
movement = MOTION_CYCLES;
robotsleft = num_robots;
counter = 0L;
while (robotsleft > 1 && counter < limit) {
	robotsleft = 0;
	for (i = 0; i < num_robots; i++) {
		if (robots[i].status == ACTIVE) {
			robotsleft++;
			cur_robot = &robots[i];
		}
	}
	cycle(num_robots);
	if (outputToFullScreen) update_disp();
	if (outputToFullScreen) std::this_thread::sleep_for(std::chrono::milliseconds(1));

	if (--movement == 0) {
		counter += MOTION_CYCLES;
		movement = MOTION_CYCLES;
		move_robots(0);
		move_miss(0);
#ifdef DOS
		kbhit();  /* check keyboard so ctrl-break can work */
#endif
		for (i = 0; i < num_robots; i++) {
			for (j = 0; j < MIS_ROBOT; j++) {
				if (missiles[i][j].stat == EXPLODING) {
					count_miss(i, j);
				}
			}
		}
	}
}

/* allow any flying missiles to explode */
while (1) {
	k = 0;
	for (i = 0; i < num_robots; i++) {
		for (j = 0; j < MIS_ROBOT; j++) {
			if (missiles[i][j].stat == FLYING) {
				k = 1;
			}
		}
	}
	if (k) {
		move_robots(0);
		move_miss(0);
	}
	else
		break;
}

if (outputToStdout) printf(" cycles = %ld:\n  Survivors:\n", counter);

k = 0;
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (outputToStdout) 
			printf("   (%d)%14s: damage=%% %d  ", i + 1, robots[i].name,
			robots[i].damage);
    if (i == 1) {
      if (outputToStdout) printf("\n");
    }
    else {
      if (outputToStdout) printf("\t");
    }
		k++;
	}
}

if (k == 0) {
	if (outputToStdout) printf("mutual destruction\n");
}
else {
	if (outputToStdout) printf("\n");
}

if (outputToStdout) printf("  Cumulative score:\n");
for (i = 0; i < num_robots; i++) {
	if (robots[i].status == ACTIVE) {
		if (k == 1)
			wins[i]++;
		else
			ties[i]++;
	}
	if (outputToStdout) printf("   (%d)%14s: wins=%d ties=%d  ", i + 1, robots[i].name,
		wins[i], ties[i]);
  if (i == 1) {
    if (outputToStdout) printf("\n");
  }
  else {
    if (outputToStdout) printf("\t");
  }
}
if (outputToStdout) printf("\n");
stopAll.store(1);
for (int i = 0; i < 10000; ++i){
	auto end = true;
	for (j = 0; j < 4; ++j){
		if (robotStatus[j] != StatusException){
			end = false;
		}
	}
	if (end) 
		break;
	cycle(num_robots);
	std::this_thread::yield();
}
		for (auto it = begin(allServersThreads); it != end(allServersThreads); ++it){
			try{
				(*it).get();
			}
			catch (std::exception &){
				;
			}
		}
		stopAll.store(0);
	}
	if (outputToStdout) fprintf(stderr, "\nMatch play finished.\n\n");
	return ;

}